

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

bool IsBlockTerminator(RegVmLoweredInstruction *lowInstruction)

{
  RegVmLoweredInstruction *lowInstruction_local;
  
  if ((lowInstruction->code - rviJmp < 3) || (lowInstruction->code == rviReturn)) {
    lowInstruction_local._7_1_ = true;
  }
  else {
    lowInstruction_local._7_1_ = false;
  }
  return lowInstruction_local._7_1_;
}

Assistant:

bool IsBlockTerminator(RegVmLoweredInstruction *lowInstruction)
{
	switch(lowInstruction->code)
	{
	case rviJmp:
	case rviJmpz:
	case rviJmpnz:
	case rviReturn:
		return true;
	default:
		break;
	}

	return false;
}